

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  char cVar1;
  xpath_ast_node *pxVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  bool bVar10;
  char cVar11;
  byte *pbVar12;
  long lVar13;
  char_t *__dest;
  char *pcVar14;
  byte bVar15;
  byte bVar16;
  char cVar17;
  xpath_ast_node *pxVar18;
  undefined1 in_XMM0_Bi;
  undefined1 extraout_XMM0_Bi;
  undefined1 extraout_XMM0_Bi_00;
  undefined1 extraout_XMM0_Bi_01;
  undefined1 extraout_XMM0_Bi_02;
  undefined1 extraout_XMM0_Bi_03;
  undefined1 in_XMM0_Bj;
  undefined1 extraout_XMM0_Bj;
  undefined1 extraout_XMM0_Bj_00;
  undefined1 extraout_XMM0_Bj_01;
  undefined1 extraout_XMM0_Bj_02;
  undefined1 extraout_XMM0_Bj_03;
  undefined1 in_XMM0_Bk;
  undefined1 extraout_XMM0_Bk;
  undefined1 extraout_XMM0_Bk_00;
  undefined1 extraout_XMM0_Bk_01;
  undefined1 extraout_XMM0_Bk_02;
  undefined1 extraout_XMM0_Bk_03;
  undefined1 in_XMM0_Bl;
  undefined1 extraout_XMM0_Bl;
  undefined1 extraout_XMM0_Bl_00;
  undefined1 extraout_XMM0_Bl_01;
  undefined1 extraout_XMM0_Bl_02;
  undefined1 extraout_XMM0_Bl_03;
  undefined1 in_XMM0_Bm;
  undefined1 extraout_XMM0_Bm;
  undefined1 extraout_XMM0_Bm_00;
  undefined1 extraout_XMM0_Bm_01;
  undefined1 extraout_XMM0_Bm_02;
  undefined1 extraout_XMM0_Bm_03;
  undefined1 in_XMM0_Bn;
  undefined1 extraout_XMM0_Bn;
  undefined1 extraout_XMM0_Bn_00;
  undefined1 extraout_XMM0_Bn_01;
  undefined1 extraout_XMM0_Bn_02;
  undefined1 extraout_XMM0_Bn_03;
  undefined1 in_XMM0_Bo;
  undefined1 extraout_XMM0_Bo;
  undefined1 extraout_XMM0_Bo_00;
  undefined1 extraout_XMM0_Bo_01;
  undefined1 extraout_XMM0_Bo_02;
  undefined1 extraout_XMM0_Bo_03;
  undefined1 in_XMM0_Bp;
  undefined1 extraout_XMM0_Bp;
  undefined1 extraout_XMM0_Bp_00;
  undefined1 extraout_XMM0_Bp_01;
  undefined1 extraout_XMM0_Bp_02;
  undefined1 extraout_XMM0_Bp_03;
  uchar table [128];
  char local_98 [136];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi;
    in_XMM0_Bj = extraout_XMM0_Bj;
    in_XMM0_Bk = extraout_XMM0_Bk;
    in_XMM0_Bl = extraout_XMM0_Bl;
    in_XMM0_Bm = extraout_XMM0_Bm;
    in_XMM0_Bn = extraout_XMM0_Bn;
    in_XMM0_Bo = extraout_XMM0_Bo;
    in_XMM0_Bp = extraout_XMM0_Bp;
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi_00;
    in_XMM0_Bj = extraout_XMM0_Bj_00;
    in_XMM0_Bk = extraout_XMM0_Bk_00;
    in_XMM0_Bl = extraout_XMM0_Bl_00;
    in_XMM0_Bm = extraout_XMM0_Bm_00;
    in_XMM0_Bn = extraout_XMM0_Bn_00;
    in_XMM0_Bo = extraout_XMM0_Bo_00;
    in_XMM0_Bp = extraout_XMM0_Bp_00;
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
    in_XMM0_Bi = extraout_XMM0_Bi_01;
    in_XMM0_Bj = extraout_XMM0_Bj_01;
    in_XMM0_Bk = extraout_XMM0_Bk_01;
    in_XMM0_Bl = extraout_XMM0_Bl_01;
    in_XMM0_Bm = extraout_XMM0_Bm_01;
    in_XMM0_Bn = extraout_XMM0_Bn_01;
    in_XMM0_Bo = extraout_XMM0_Bo_01;
    in_XMM0_Bp = extraout_XMM0_Bp_01;
  }
  bVar15 = this->_type;
  if ((bVar15 & 0xfe) == 0x10) {
    pxVar18 = this->_right;
    if (pxVar18 != (xpath_ast_node *)0x0) {
      if (((pxVar18->_type == '\x03') && (pxVar18->_left->_type == '\x16')) &&
         (pxVar2 = pxVar18->_right, pxVar2->_rettype == '\x02')) {
        this->_right = pxVar2;
        pxVar18 = pxVar2;
      }
      if (this->_test != '\0') {
        __assert_fail("_test == predicate_default",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x2ac5,
                      "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                     );
      }
      if (pxVar18->_type == '\x13') {
        in_XMM0_Bi = 0;
        in_XMM0_Bj = 0;
        in_XMM0_Bk = 0;
        in_XMM0_Bl = 0;
        in_XMM0_Bm = 0;
        in_XMM0_Bn = 0;
        in_XMM0_Bo = 0;
        in_XMM0_Bp = 0;
        if (((pxVar18->_data).number == 1.0) && (!NAN((pxVar18->_data).number))) {
          this->_test = '\x03';
          goto LAB_0018deb6;
        }
      }
      if (pxVar18->_rettype == '\x02') {
        if ((byte)(pxVar18->_type - 0x13U) < 3) {
          this->_test = '\x02';
        }
      }
      else {
        bVar10 = is_posinv_expr(pxVar18);
        in_XMM0_Bi = extraout_XMM0_Bi_03;
        in_XMM0_Bj = extraout_XMM0_Bj_03;
        in_XMM0_Bk = extraout_XMM0_Bk_03;
        in_XMM0_Bl = extraout_XMM0_Bl_03;
        in_XMM0_Bm = extraout_XMM0_Bm_03;
        in_XMM0_Bn = extraout_XMM0_Bn_03;
        in_XMM0_Bo = extraout_XMM0_Bo_03;
        in_XMM0_Bp = extraout_XMM0_Bp_03;
        if (bVar10) {
          this->_test = '\x01';
        }
      }
    }
  }
  else {
    if (bVar15 != 0x38) goto LAB_0018deb9;
    if (((((((byte)this->_axis < 0xd) && ((0x1038U >> ((byte)this->_axis & 0x1f) & 1) != 0)) &&
          (pxVar18 = this->_left, pxVar18 != (xpath_ast_node *)0x0)) &&
         ((pxVar18->_type == '8' && (pxVar18->_axis == '\x05')))) && (pxVar18->_test == '\x02')) &&
       ((pxVar18->_right == (xpath_ast_node *)0x0 &&
        (bVar10 = is_posinv_step(this), in_XMM0_Bi = extraout_XMM0_Bi_02,
        in_XMM0_Bj = extraout_XMM0_Bj_02, in_XMM0_Bk = extraout_XMM0_Bk_02,
        in_XMM0_Bl = extraout_XMM0_Bl_02, in_XMM0_Bm = extraout_XMM0_Bm_02,
        in_XMM0_Bn = extraout_XMM0_Bn_02, in_XMM0_Bo = extraout_XMM0_Bo_02,
        in_XMM0_Bp = extraout_XMM0_Bp_02, bVar10)))) {
      this->_axis = (byte)(this->_axis - 3U) < 2 ^ 5;
      this->_left = this->_left->_left;
    }
  }
LAB_0018deb6:
  bVar15 = this->_type;
LAB_0018deb9:
  if (bVar15 == 0x2c) {
    pxVar18 = this->_right;
    if (pxVar18 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar18->_type != '\x12') {
      return;
    }
    if (pxVar18->_next->_type != '\x12') {
      return;
    }
    pbVar12 = (byte *)(pxVar18->_data).string;
    pcVar14 = (pxVar18->_next->_data).string;
    uVar3 = CONCAT17(in_XMM0_Bp,
                     CONCAT16(in_XMM0_Bo,
                              CONCAT15(in_XMM0_Bn,
                                       CONCAT14(in_XMM0_Bm,
                                                CONCAT13(in_XMM0_Bl,
                                                         CONCAT12(in_XMM0_Bk,
                                                                  CONCAT11(in_XMM0_Bj,in_XMM0_Bi))))
                                      ))) ^
            CONCAT17(in_XMM0_Bp,
                     CONCAT16(in_XMM0_Bo,
                              CONCAT15(in_XMM0_Bn,
                                       CONCAT14(in_XMM0_Bm,
                                                CONCAT13(in_XMM0_Bl,
                                                         CONCAT12(in_XMM0_Bk,
                                                                  CONCAT11(in_XMM0_Bj,in_XMM0_Bi))))
                                      )));
    local_98[0x78] = (char)uVar3;
    local_98[0x79] = (char)(uVar3 >> 8);
    local_98[0x7a] = (char)(uVar3 >> 0x10);
    local_98[0x7b] = (char)(uVar3 >> 0x18);
    local_98[0x7c] = (char)(uVar3 >> 0x20);
    local_98[0x7d] = (char)(uVar3 >> 0x28);
    local_98[0x7e] = (char)(uVar3 >> 0x30);
    local_98[0x7f] = (char)(uVar3 >> 0x38);
    local_98[0x70] = 0;
    local_98[0x71] = 0;
    local_98[0x72] = 0;
    local_98[0x73] = 0;
    local_98[0x74] = 0;
    local_98[0x75] = 0;
    local_98[0x76] = 0;
    local_98[0x77] = 0;
    local_98[0x60] = 0;
    local_98[0x61] = 0;
    local_98[0x62] = 0;
    local_98[99] = 0;
    local_98[100] = 0;
    local_98[0x65] = 0;
    local_98[0x66] = 0;
    local_98[0x67] = 0;
    local_98[0x68] = local_98[0x78];
    local_98[0x69] = local_98[0x79];
    local_98[0x6a] = local_98[0x7a];
    local_98[0x6b] = local_98[0x7b];
    local_98[0x6c] = local_98[0x7c];
    local_98[0x6d] = local_98[0x7d];
    local_98[0x6e] = local_98[0x7e];
    local_98[0x6f] = local_98[0x7f];
    local_98[0x50] = 0;
    local_98[0x51] = 0;
    local_98[0x52] = 0;
    local_98[0x53] = 0;
    local_98[0x54] = 0;
    local_98[0x55] = 0;
    local_98[0x56] = 0;
    local_98[0x57] = 0;
    local_98[0x58] = local_98[0x78];
    local_98[0x59] = local_98[0x79];
    local_98[0x5a] = local_98[0x7a];
    local_98[0x5b] = local_98[0x7b];
    local_98[0x5c] = local_98[0x7c];
    local_98[0x5d] = local_98[0x7d];
    local_98[0x5e] = local_98[0x7e];
    local_98[0x5f] = local_98[0x7f];
    local_98[0x40] = 0;
    local_98[0x41] = 0;
    local_98[0x42] = 0;
    local_98[0x43] = 0;
    local_98[0x44] = 0;
    local_98[0x45] = 0;
    local_98[0x46] = 0;
    local_98[0x47] = 0;
    local_98[0x48] = local_98[0x78];
    local_98[0x49] = local_98[0x79];
    local_98[0x4a] = local_98[0x7a];
    local_98[0x4b] = local_98[0x7b];
    local_98[0x4c] = local_98[0x7c];
    local_98[0x4d] = local_98[0x7d];
    local_98[0x4e] = local_98[0x7e];
    local_98[0x4f] = local_98[0x7f];
    local_98[0x30] = 0;
    local_98[0x31] = 0;
    local_98[0x32] = 0;
    local_98[0x33] = 0;
    local_98[0x34] = 0;
    local_98[0x35] = 0;
    local_98[0x36] = 0;
    local_98[0x37] = 0;
    local_98[0x38] = local_98[0x78];
    local_98[0x39] = local_98[0x79];
    local_98[0x3a] = local_98[0x7a];
    local_98[0x3b] = local_98[0x7b];
    local_98[0x3c] = local_98[0x7c];
    local_98[0x3d] = local_98[0x7d];
    local_98[0x3e] = local_98[0x7e];
    local_98[0x3f] = local_98[0x7f];
    local_98[0x20] = 0;
    local_98[0x21] = 0;
    local_98[0x22] = 0;
    local_98[0x23] = 0;
    local_98[0x24] = 0;
    local_98[0x25] = 0;
    local_98[0x26] = 0;
    local_98[0x27] = 0;
    local_98[0x28] = local_98[0x78];
    local_98[0x29] = local_98[0x79];
    local_98[0x2a] = local_98[0x7a];
    local_98[0x2b] = local_98[0x7b];
    local_98[0x2c] = local_98[0x7c];
    local_98[0x2d] = local_98[0x7d];
    local_98[0x2e] = local_98[0x7e];
    local_98[0x2f] = local_98[0x7f];
    local_98[0x10] = 0;
    local_98[0x11] = 0;
    local_98[0x12] = 0;
    local_98[0x13] = 0;
    local_98[0x14] = 0;
    local_98[0x15] = 0;
    local_98[0x16] = 0;
    local_98[0x17] = 0;
    local_98[0x18] = local_98[0x78];
    local_98[0x19] = local_98[0x79];
    local_98[0x1a] = local_98[0x7a];
    local_98[0x1b] = local_98[0x7b];
    local_98[0x1c] = local_98[0x7c];
    local_98[0x1d] = local_98[0x7d];
    local_98[0x1e] = local_98[0x7e];
    local_98[0x1f] = local_98[0x7f];
    local_98[0] = '\0';
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_98[8] = local_98[0x78];
    local_98[9] = local_98[0x79];
    local_98[10] = local_98[0x7a];
    local_98[0xb] = local_98[0x7b];
    local_98[0xc] = local_98[0x7c];
    local_98[0xd] = local_98[0x7d];
    local_98[0xe] = local_98[0x7e];
    local_98[0xf] = local_98[0x7f];
    bVar16 = *pbVar12;
    if (bVar16 != 0) {
      do {
        pbVar12 = pbVar12 + 1;
        bVar15 = 0x2c;
        if (((char)bVar16 < '\0') || (cVar1 = *pcVar14, cVar1 < '\0')) goto LAB_0018e0bd;
        if (local_98[bVar16] == '\0') {
          cVar17 = cVar1;
          if (cVar1 == '\0') {
            cVar17 = -0x80;
          }
          local_98[bVar16] = cVar17;
        }
        pcVar14 = pcVar14 + (cVar1 != '\0');
        bVar16 = *pbVar12;
      } while (bVar16 != 0);
    }
    lVar13 = 0;
    do {
      cVar1 = local_98[lVar13];
      cVar17 = local_98[lVar13 + 1];
      cVar4 = local_98[lVar13 + 2];
      cVar5 = local_98[lVar13 + 3];
      cVar6 = local_98[lVar13 + 4];
      cVar7 = local_98[lVar13 + 5];
      cVar8 = local_98[lVar13 + 6];
      cVar9 = local_98[lVar13 + 7];
      cVar11 = (char)lVar13;
      if (cVar1 == '\0') {
        local_98[lVar13] = cVar11;
      }
      if (cVar17 == '\0') {
        local_98[lVar13 + 1] = cVar11 + '\x01';
      }
      if (cVar4 == '\0') {
        local_98[lVar13 + 2] = cVar11 + '\x02';
      }
      if (cVar5 == '\0') {
        local_98[lVar13 + 3] = cVar11 + '\x03';
      }
      if (cVar6 == '\0') {
        local_98[lVar13 + 4] = cVar11 + '\x04';
      }
      if (cVar7 == '\0') {
        local_98[lVar13 + 5] = cVar11 + '\x05';
      }
      if (cVar8 == '\0') {
        local_98[lVar13 + 6] = cVar11 + '\x06';
      }
      if (cVar9 == '\0') {
        local_98[lVar13 + 7] = cVar11 + '\a';
      }
      if (cVar1 == '\0') {
        local_98[lVar13 + 8] = cVar11 + '\b';
      }
      if (cVar17 == '\0') {
        local_98[lVar13 + 9] = cVar11 + '\t';
      }
      if (cVar4 == '\0') {
        local_98[lVar13 + 10] = cVar11 + '\n';
      }
      if (cVar5 == '\0') {
        local_98[lVar13 + 0xb] = cVar11 + '\v';
      }
      if (cVar6 == '\0') {
        local_98[lVar13 + 0xc] = cVar11 + '\f';
      }
      if (cVar7 == '\0') {
        local_98[lVar13 + 0xd] = cVar11 + '\r';
      }
      if (cVar8 == '\0') {
        local_98[lVar13 + 0xe] = cVar11 + '\x0e';
      }
      if (cVar9 == '\0') {
        local_98[lVar13 + 0xf] = cVar11 + '\x0f';
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x80);
    __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
    if (__dest != (char_t *)0x0) {
      memcpy(__dest,local_98,0x80);
      this->_type = ':';
      (this->_data).string = __dest;
      return;
    }
    bVar15 = this->_type;
  }
LAB_0018e0bd:
  if (((((bVar15 == 3) && (pxVar18 = this->_left, pxVar18 != (xpath_ast_node *)0x0)) &&
       (pxVar2 = this->_right, pxVar2 != (xpath_ast_node *)0x0)) &&
      (((pxVar18->_type == '8' && (pxVar18->_axis == '\x02')) &&
       ((pxVar18->_test == '\x01' &&
        ((pxVar18->_left == (xpath_ast_node *)0x0 && (pxVar18->_right == (xpath_ast_node *)0x0))))))
      )) && ((pxVar2->_type == '\x12' || ((pxVar2->_type == '\x14' && (pxVar2->_rettype == '\x03')))
             ))) {
    this->_type = ';';
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}